

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::BinaryReaderObjdumpBase
          (BinaryReaderObjdumpBase *this,uint8_t *data,size_t size,ObjdumpOptions *options,
          ObjdumpState *objdump_state)

{
  ObjdumpState *objdump_state_local;
  ObjdumpOptions *options_local;
  size_t size_local;
  uint8_t *data_local;
  BinaryReaderObjdumpBase *this_local;
  
  BinaryReaderNop::BinaryReaderNop(&this->super_BinaryReaderNop);
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderObjdumpBase_0019e120;
  this->options_ = options;
  this->objdump_state_ = objdump_state;
  this->data_ = data;
  this->size_ = size;
  this->print_details_ = false;
  this->reloc_section_ = Invalid;
  std::vector<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>::vector
            (&this->section_types_);
  this->section_found_ = false;
  std::__cxx11::string::string((string *)&this->module_name_);
  Opcode::Opcode(&this->current_opcode,Unreachable);
  FileStream::CreateStderr();
  ZeroMemory<unsigned_long[14]>(&this->section_starts_);
  return;
}

Assistant:

BinaryReaderObjdumpBase::BinaryReaderObjdumpBase(const uint8_t* data,
                                                 size_t size,
                                                 ObjdumpOptions* options,
                                                 ObjdumpState* objdump_state)
    : options_(options),
      objdump_state_(objdump_state),
      data_(data),
      size_(size),
      err_stream_(FileStream::CreateStderr()) {
  ZeroMemory(section_starts_);
}